

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::eval_rightShiftVecScalar_ivec4(ShaderEvalContext *c)

{
  float *pfVar1;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  _anonymous_namespace_ local_30 [16];
  Vector<int,_4> local_20;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle(&local_50,(int)c + 0x30,1,2,3);
  tcu::Vector<float,_4>::asInt(&local_40);
  pfVar1 = tcu::Vector<float,_4>::x(local_10->in + 1);
  sr::(anonymous_namespace)::rightShiftVecScalar<int,4>
            (local_30,(Vector<int,_4> *)&local_40,(int)*pfVar1);
  tcu::Vector<int,_4>::asFloat(&local_20);
  *(undefined8 *)(local_10->color).m_data = local_20.m_data._0_8_;
  *(undefined8 *)((local_10->color).m_data + 2) = local_20.m_data._8_8_;
  return;
}

Assistant:

void eval_selection_ivec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(1, 0).asInt(),			c.in[2].swizzle(2, 1).asInt()).asFloat(); }